

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QTransform * __thiscall
QGraphicsViewPrivate::mapToViewTransform(QGraphicsViewPrivate *this,QGraphicsItem *item)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItem *in_RDX;
  QGraphicsViewPrivate *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  qreal qVar4;
  QGraphicsItemPrivate *itemd;
  QGraphicsItem *parentItem;
  QGraphicsView *q;
  QPointF offset;
  QTransform tr;
  QTransform move;
  QGraphicsViewPrivate *in_stack_fffffffffffffe10;
  QGraphicsItem *this_00;
  QGraphicsItem *local_1c8;
  QTransform *in_stack_fffffffffffffe58;
  QGraphicsItem *in_stack_fffffffffffffe60;
  QTransform local_148;
  QTransform local_f8;
  undefined1 local_a8 [160];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  q_func(in_RSI);
  if ((*(uint *)&in_RSI->field_0x300 >> 5 & 1) != 0) {
    updateScroll(in_stack_fffffffffffffe10);
  }
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RDX->d_ptr);
  bVar1 = QGraphicsItemPrivate::itemIsUntransformable(pQVar2);
  if (bVar1) {
    QGraphicsView::viewportTransform((QGraphicsView *)in_RSI);
    QGraphicsItem::deviceTransform(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  }
  else {
    QPointF::QPointF((QPointF *)&stack0xfffffffffffffe58);
    local_1c8 = in_RDX;
    do {
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               data(&local_1c8->d_ptr);
      if (pQVar2->transformData != (TransformData *)0x0) break;
      QPointF::operator+=((QPointF *)&stack0xfffffffffffffe58,&pQVar2->pos);
      local_1c8 = pQVar2->parent;
    } while (local_1c8 != (QGraphicsItem *)0x0);
    memcpy(local_a8,&DAT_00b47bc8,0x50);
    qVar3 = QPointF::x((QPointF *)&stack0xfffffffffffffe58);
    qVar4 = QPointF::y((QPointF *)&stack0xfffffffffffffe58);
    QTransform::fromTranslate(qVar3,qVar4);
    if (local_1c8 == (QGraphicsItem *)0x0) {
      QTransform::translate((double)-in_RSI->scrollX,(double)-in_RSI->scrollY);
      if ((*(uint *)&in_RSI->field_0x300 >> 4 & 1) == 0) {
        QTransform::operator*((QTransform *)in_RDI,(QTransform *)&in_RSI->matrix);
      }
      else {
        memcpy(in_RDI,local_a8,0x50);
      }
    }
    else {
      memcpy(&local_f8,&DAT_00b47c18,0x50);
      QGraphicsItem::sceneTransform(this_00);
      if ((*(uint *)&in_RSI->field_0x300 >> 4 & 1) == 0) {
        QTransform::operator*=(&local_f8,(QTransform *)&in_RSI->matrix);
      }
      QTransform::operator*(&local_148,(QTransform *)local_a8);
      QTransform::fromTranslate((double)-in_RSI->scrollX,(double)-in_RSI->scrollY);
      QTransform::operator*((QTransform *)in_RDI,(QTransform *)&local_148);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QTransform *)this_00;
}

Assistant:

QTransform QGraphicsViewPrivate::mapToViewTransform(const QGraphicsItem *item) const
{
    Q_Q(const QGraphicsView);
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();

    if (item->d_ptr->itemIsUntransformable())
        return item->deviceTransform(q->viewportTransform());

    // Translate-only
    // COMBINE
    QPointF offset;
    const QGraphicsItem *parentItem = item;
    const QGraphicsItemPrivate *itemd;
    do {
        itemd = parentItem->d_ptr.data();
        if (itemd->transformData)
            break;
        offset += itemd->pos;
    } while ((parentItem = itemd->parent));

    QTransform move = QTransform::fromTranslate(offset.x(), offset.y());
    if (!parentItem) {
        move.translate(-scrollX, -scrollY);
        return identityMatrix ? move : matrix * move;
    }
    QTransform tr = parentItem->sceneTransform();
    if (!identityMatrix)
        tr *= matrix;
    return move * tr * QTransform::fromTranslate(-scrollX, -scrollY);
}